

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSAX.c
# Opt level: O0

void externalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf(_stdout,"SAX.externalSubset(%s,",name);
    if (ExternalID == (xmlChar *)0x0) {
      fprintf(_stdout," ,");
    }
    else {
      fprintf(_stdout," %s,",ExternalID);
    }
    if (SystemID == (xmlChar *)0x0) {
      fprintf(_stdout," )\n");
    }
    else {
      fprintf(_stdout," %s)\n",SystemID);
    }
  }
  return;
}

Assistant:

static void
externalSubsetDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(stdout, "SAX.externalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(stdout, " ,");
    else
	fprintf(stdout, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(stdout, " )\n");
    else
	fprintf(stdout, " %s)\n", SystemID);
}